

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgetresizehandler_p.cpp
# Opt level: O3

void QWidgetResizeHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_id == 0 && _c == InvokeMetaMethod) {
    QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
  }
  if (((_c == IndexOfMethod) && (*_a[1] == activate)) && (*(long *)((long)_a[1] + 8) == 0)) {
    *(undefined4 *)*_a = 0;
  }
  return;
}

Assistant:

void QWidgetResizeHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetResizeHandler *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activate(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWidgetResizeHandler::*)()>(_a, &QWidgetResizeHandler::activate, 0))
            return;
    }
}